

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::ValueFlag<StringAssignable,_args::ValueReader>::ValueFlag
          (ValueFlag<StringAssignable,_args::ValueReader> *this,Group *group_,string *name_,
          string *help_,Matcher *matcher_,StringAssignable *defaultValue_,Options options_)

{
  ValueFlagBase::ValueFlagBase(&this->super_ValueFlagBase,name_,help_,matcher_,options_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlag_00202ab0;
  std::__cxx11::string::string((string *)&this->value,(string *)defaultValue_);
  std::__cxx11::string::string((string *)&this->defaultValue,(string *)defaultValue_);
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

ValueFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, const T &defaultValue_, Options options_): ValueFlagBase(name_, help_, std::move(matcher_), options_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }